

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

int xmlSchemaCompareNormStrings(xmlChar *x,xmlChar *y)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  
  while (((ulong)*x < 0x21 && ((0x100002600U >> ((ulong)*x & 0x3f) & 1) != 0))) {
    x = x + 1;
  }
  while (((ulong)*y < 0x21 && ((0x100002600U >> ((ulong)*y & 0x3f) & 1) != 0))) {
    y = y + 1;
  }
  do {
    bVar2 = *x;
    if (bVar2 == 0) {
LAB_001b1f87:
      if (*y == 0) {
        return 0;
      }
      while( true ) {
        uVar3 = (ulong)*y;
        if (0x20 < uVar3) {
          return -1;
        }
        if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
        y = y + 1;
      }
      if (uVar3 != 0) {
        return -1;
      }
      return 0;
    }
    bVar1 = *y;
    if (bVar1 == 0) {
      if (bVar2 != 0) {
        while( true ) {
          uVar3 = (ulong)*x;
          if (0x20 < uVar3) {
            return 1;
          }
          if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
          x = x + 1;
        }
        if (uVar3 != 0) {
          return 1;
        }
      }
      goto LAB_001b1f87;
    }
    if ((bVar2 < 0x21) && ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      if ((0x20 < bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        return (uint)bVar2 - (uint)bVar1;
      }
      while (((ulong)*x < 0x21 && ((0x100002600U >> ((ulong)*x & 0x3f) & 1) != 0))) {
        x = x + 1;
      }
      while (((ulong)*y < 0x21 && ((0x100002600U >> ((ulong)*y & 0x3f) & 1) != 0))) {
        y = y + 1;
      }
    }
    else {
      if (bVar2 < bVar1) {
        return -1;
      }
      if (bVar2 != bVar1) {
        return 1;
      }
      y = y + 1;
      x = x + 1;
    }
  } while( true );
}

Assistant:

static int
xmlSchemaCompareNormStrings(const xmlChar *x,
			    const xmlChar *y) {
    int tmp;

    while (IS_BLANK_CH(*x)) x++;
    while (IS_BLANK_CH(*y)) y++;
    while ((*x != 0) && (*y != 0)) {
	if (IS_BLANK_CH(*x)) {
	    if (!IS_BLANK_CH(*y)) {
		tmp = *x - *y;
		return(tmp);
	    }
	    while (IS_BLANK_CH(*x)) x++;
	    while (IS_BLANK_CH(*y)) y++;
	} else {
	    tmp = *x++ - *y++;
	    if (tmp < 0)
		return(-1);
	    if (tmp > 0)
		return(1);
	}
    }
    if (*x != 0) {
	while (IS_BLANK_CH(*x)) x++;
	if (*x != 0)
	    return(1);
    }
    if (*y != 0) {
	while (IS_BLANK_CH(*y)) y++;
	if (*y != 0)
	    return(-1);
    }
    return(0);
}